

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O0

void __thiscall
JsUtil::
BaseDictionary<IntBoundCheckCompatibilityId,_IntBoundCheck,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
::RemoveAt(BaseDictionary<IntBoundCheckCompatibilityId,_IntBoundCheck,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
           *this,int i,int last,uint targetBucket)

{
  int local_34;
  uint targetBucket_local;
  int last_local;
  int i_local;
  BaseDictionary<IntBoundCheckCompatibilityId,_IntBoundCheck,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  *this_local;
  
  if (last < 0) {
    this->buckets[targetBucket] =
         this->entries[i].
         super_DefaultHashedEntry<IntBoundCheckCompatibilityId,_IntBoundCheck,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
         .super_ImplicitKeyValueEntry<IntBoundCheckCompatibilityId,_IntBoundCheck>.
         super_ValueEntry<IntBoundCheck,_JsUtil::(anonymous_namespace)::ValueEntryData<IntBoundCheck>_>
         .super_ValueEntryData<IntBoundCheck>.next;
  }
  else {
    this->entries[last].
    super_DefaultHashedEntry<IntBoundCheckCompatibilityId,_IntBoundCheck,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
    .super_ImplicitKeyValueEntry<IntBoundCheckCompatibilityId,_IntBoundCheck>.
    super_ValueEntry<IntBoundCheck,_JsUtil::(anonymous_namespace)::ValueEntryData<IntBoundCheck>_>.
    super_ValueEntryData<IntBoundCheck>.next =
         this->entries[i].
         super_DefaultHashedEntry<IntBoundCheckCompatibilityId,_IntBoundCheck,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
         .super_ImplicitKeyValueEntry<IntBoundCheckCompatibilityId,_IntBoundCheck>.
         super_ValueEntry<IntBoundCheck,_JsUtil::(anonymous_namespace)::ValueEntryData<IntBoundCheck>_>
         .super_ValueEntryData<IntBoundCheck>.next;
  }
  anon_unknown_3::
  ValueEntry<IntBoundCheck,_JsUtil::(anonymous_namespace)::ValueEntryData<IntBoundCheck>_>::Clear
            ((ValueEntry<IntBoundCheck,_JsUtil::(anonymous_namespace)::ValueEntryData<IntBoundCheck>_>
              *)(this->entries + i));
  if (this->freeCount == 0) {
    local_34 = -1;
  }
  else {
    local_34 = this->freeList;
  }
  SetNextFreeEntryIndex(this,this->entries + i,local_34);
  this->freeList = i;
  this->freeCount = this->freeCount + 1;
  if (this->stats != (Type)0x0) {
    DictionaryStats::Remove(this->stats,this->buckets[targetBucket] == -1);
  }
  return;
}

Assistant:

inline void RemoveAt(const int i, const int last, const uint targetBucket)
        {
            if (last < 0)
            {
                buckets[targetBucket] = entries[i].next;
            }
            else
            {
                entries[last].next = entries[i].next;
            }
            entries[i].Clear();
            SetNextFreeEntryIndex(entries[i], freeCount == 0 ? -1 : freeList);
            freeList = i;
            freeCount++;
#if PROFILE_DICTIONARY
            if (stats)
                stats->Remove(buckets[targetBucket] == -1);
#endif
        }